

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzerResults.cpp
# Opt level: O2

void __thiscall
I2cAnalyzerResults::GenerateBubbleText
          (I2cAnalyzerResults *this,U64 frame_index,Channel *param_2,DisplayBase display_base)

{
  ostream *poVar1;
  allocator local_299;
  char *local_298 [4];
  char ack [32];
  Frame frame;
  byte local_240;
  undefined7 uStack_23f;
  char local_230;
  byte local_22f;
  char number_str [128];
  stringstream ss;
  ostream local_198 [8];
  string local_190 [368];
  
  AnalyzerResults::ClearResultStrings();
  AnalyzerResults::GetFrame((ulonglong)&frame);
  if ((local_22f & 1) == 0) {
    if ((local_22f & 2) == 0) {
      builtin_strncpy(ack,"NAK",4);
    }
    else {
      builtin_strncpy(ack,"Missing ACK/NAK",0x10);
    }
  }
  else {
    builtin_strncpy(ack,"ACK",4);
  }
  if (local_230 == '\0') {
    AnalyzerHelpers::GetNumberString
              (CONCAT71(uStack_23f,local_240) >> 1,display_base,7,number_str,0x80);
    if ((local_240 & 1) == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar1 = std::operator<<(local_198,"W[");
      poVar1 = std::operator<<(poVar1,number_str);
      std::operator<<(poVar1,"]");
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_298[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)local_298);
      std::__cxx11::string::string((string *)local_298,"",&local_299);
      std::__cxx11::stringbuf::str(local_190);
      std::__cxx11::string::~string((string *)local_298);
      poVar1 = std::operator<<(local_198,"Write [");
      poVar1 = std::operator<<(poVar1,number_str);
      std::operator<<(poVar1,"]");
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_298[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)local_298);
      std::__cxx11::string::string((string *)local_298,"",&local_299);
      std::__cxx11::stringbuf::str(local_190);
      std::__cxx11::string::~string((string *)local_298);
      poVar1 = std::operator<<(local_198,"Write [");
      poVar1 = std::operator<<(poVar1,number_str);
      poVar1 = std::operator<<(poVar1,"] + ");
      std::operator<<(poVar1,ack);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_298[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)local_298);
      std::__cxx11::string::string((string *)local_298,"",&local_299);
      std::__cxx11::stringbuf::str(local_190);
      std::__cxx11::string::~string((string *)local_298);
      poVar1 = std::operator<<(local_198,"Setup Write to [");
      poVar1 = std::operator<<(poVar1,number_str);
      poVar1 = std::operator<<(poVar1,"] + ");
      std::operator<<(poVar1,ack);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_298[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      AnalyzerResults::AddResultString
                ((char *)this,"R",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      poVar1 = std::operator<<(local_198,"R[");
      poVar1 = std::operator<<(poVar1,number_str);
      std::operator<<(poVar1,"]");
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_298[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)local_298);
      std::__cxx11::string::string((string *)local_298,"",&local_299);
      std::__cxx11::stringbuf::str(local_190);
      std::__cxx11::string::~string((string *)local_298);
      poVar1 = std::operator<<(local_198,"Read [");
      poVar1 = std::operator<<(poVar1,number_str);
      std::operator<<(poVar1,"]");
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_298[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)local_298);
      std::__cxx11::string::string((string *)local_298,"",&local_299);
      std::__cxx11::stringbuf::str(local_190);
      std::__cxx11::string::~string((string *)local_298);
      poVar1 = std::operator<<(local_198,"Read [");
      poVar1 = std::operator<<(poVar1,number_str);
      poVar1 = std::operator<<(poVar1,"] + ");
      std::operator<<(poVar1,ack);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_298[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)local_298);
      std::__cxx11::string::string((string *)local_298,"",&local_299);
      std::__cxx11::stringbuf::str(local_190);
      std::__cxx11::string::~string((string *)local_298);
      poVar1 = std::operator<<(local_198,"Setup Read to [");
      poVar1 = std::operator<<(poVar1,number_str);
      poVar1 = std::operator<<(poVar1,"] + ");
      std::operator<<(poVar1,ack);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_298[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
  }
  else {
    AnalyzerHelpers::GetNumberString(CONCAT71(uStack_23f,local_240),display_base,8,number_str,0x80);
    AnalyzerResults::AddResultString
              ((char *)this,number_str,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar1 = std::operator<<(local_198,number_str);
    poVar1 = std::operator<<(poVar1," + ");
    std::operator<<(poVar1,ack);
    std::__cxx11::stringbuf::str();
    AnalyzerResults::AddResultString
              ((char *)this,local_298[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  std::__cxx11::string::~string((string *)local_298);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  Frame::~Frame(&frame);
  return;
}

Assistant:

void I2cAnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& /*channel*/,
                                             DisplayBase display_base ) // unrefereced vars commented out to remove warnings.
{
    // we only need to pay attention to 'channel' if we're making bubbles for more than one channel (as set by
    // AddChannelBubblesWillAppearOn)
    ClearResultStrings();
    Frame frame = GetFrame( frame_index );

    char ack[ 32 ];
    if( ( frame.mFlags & I2C_FLAG_ACK ) != 0 )
        snprintf( ack, sizeof( ack ), "ACK" );
    else if( ( frame.mFlags & I2C_MISSING_FLAG_ACK ) != 0 )
        snprintf( ack, sizeof( ack ), "Missing ACK/NAK" );
    else
        snprintf( ack, sizeof( ack ), "NAK" );

    if( frame.mType == I2cAddress )
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1 >> 1, display_base, 7, number_str, 128 );

        I2cDirection direction;
        if( ( frame.mData1 & 0x1 ) != 0 )
            direction = I2C_READ;
        else
            direction = I2C_WRITE;

        if( direction == I2C_READ )
        {
            std::stringstream ss;
            AddResultString( "R" );

            ss << "R[" << number_str << "]";
            AddResultString( ss.str().c_str() );
            ss.str( "" );

            ss << "Read [" << number_str << "]";
            AddResultString( ss.str().c_str() );
            ss.str( "" );

            ss << "Read [" << number_str << "] + " << ack;
            AddResultString( ss.str().c_str() );
            ss.str( "" );

            ss << "Setup Read to [" << number_str << "] + " << ack;
            AddResultString( ss.str().c_str() );
        }
        else
        {
            std::stringstream ss;
            ss << "W[" << number_str << "]";
            AddResultString( ss.str().c_str() );
            ss.str( "" );

            ss << "Write [" << number_str << "]";
            AddResultString( ss.str().c_str() );
            ss.str( "" );

            ss << "Write [" << number_str << "] + " << ack;
            AddResultString( ss.str().c_str() );
            ss.str( "" );

            ss << "Setup Write to [" << number_str << "] + " << ack;
            AddResultString( ss.str().c_str() );
        }
    }
    else
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );

        AddResultString( number_str );

        std::stringstream ss;
        ss << number_str << " + " << ack;
        AddResultString( ss.str().c_str() );
    }
}